

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O1

void __thiscall iDynTree::LinkPositions::~LinkPositions(LinkPositions *this)

{
  pointer pTVar1;
  Transform identityTransform;
  
  iDynTree::Transform::Identity();
  std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::resize(&this->m_linkPos,0)
  ;
  pTVar1 = (this->m_linkPos).
           super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)(this->m_linkPos).
                                 super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar1);
  }
  return;
}

Assistant:

LinkPositions::~LinkPositions()
{
    resize(0);
}